

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

Node * prvTidyFindBody(TidyDocImpl *doc)

{
  TidyTagId TVar1;
  Node *pNVar2;
  Node **ppNVar3;
  
  if (doc == (TidyDocImpl *)0x0) {
    pNVar2 = (Node *)0x0;
    goto LAB_001443b4;
  }
  ppNVar3 = &(doc->root).content;
  while( true ) {
    pNVar2 = *ppNVar3;
LAB_001443b4:
    if (pNVar2 == (Node *)0x0) {
      return (Node *)0x0;
    }
    if ((pNVar2->tag != (Dict *)0x0) && (pNVar2->tag->id == TidyTag_HTML)) break;
    ppNVar3 = &pNVar2->next;
  }
  ppNVar3 = &pNVar2->content;
  do {
    pNVar2 = *ppNVar3;
    if (pNVar2 == (Node *)0x0) {
      return (Node *)0x0;
    }
    if (pNVar2->tag != (Dict *)0x0) {
      TVar1 = pNVar2->tag->id;
      if (TVar1 == TidyTag_BODY) {
        return pNVar2;
      }
      if (TVar1 == TidyTag_FRAMESET) {
        ppNVar3 = &pNVar2->content;
        while( true ) {
          pNVar2 = *ppNVar3;
          if (pNVar2 == (Node *)0x0) {
            return (Node *)0x0;
          }
          if ((pNVar2->tag != (Dict *)0x0) && (pNVar2->tag->id == TidyTag_NOFRAMES)) break;
          ppNVar3 = &pNVar2->next;
        }
        ppNVar3 = &pNVar2->content;
        while( true ) {
          pNVar2 = *ppNVar3;
          if (pNVar2 == (Node *)0x0) {
            return (Node *)0x0;
          }
          if ((pNVar2->tag != (Dict *)0x0) && (pNVar2->tag->id == TidyTag_BODY)) break;
          ppNVar3 = &pNVar2->next;
        }
        return pNVar2;
      }
    }
    ppNVar3 = &pNVar2->next;
  } while( true );
}

Assistant:

Node *TY_(FindBody)( TidyDocImpl* doc )
{
    Node *node = ( doc ? doc->root.content : NULL );

    while ( node && !nodeIsHTML(node) )
        node = node->next;

    if (node == NULL)
        return NULL;

    node = node->content;
    while ( node && !nodeIsBODY(node) && !nodeIsFRAMESET(node) )
        node = node->next;

    if ( node && nodeIsFRAMESET(node) )
    {
        node = node->content;
        while ( node && !nodeIsNOFRAMES(node) )
            node = node->next;

        if ( node )
        {
            node = node->content;
            while ( node && !nodeIsBODY(node) )
                node = node->next;
        }
    }

    return node;
}